

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTransport.cpp
# Opt level: O1

void __thiscall adios2::transport::NullTransport::NullTransport(NullTransport *this,Comm *comm)

{
  NullTransportImpl *pNVar1;
  char *__end;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NULL","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NULL","");
  Transport::Transport(&this->super_Transport,&local_50,&local_70,comm);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_Transport)._vptr_Transport = (_func_int **)&PTR__NullTransport_00885a38;
  pNVar1 = (NullTransportImpl *)operator_new(0x18);
  pNVar1->IsOpen = false;
  pNVar1->CurPos = 0;
  pNVar1->Capacity = 0;
  (this->Impl)._M_t.
  super___uniq_ptr_impl<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
  .super__Head_base<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_false>._M_head_impl
       = pNVar1;
  return;
}

Assistant:

NullTransport::NullTransport(helper::Comm const &comm)
: Transport("NULL", "NULL", comm), Impl(new NullTransportImpl)
{
}